

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O2

void __thiscall
ConvertAddrCommand::execute(ConvertAddrCommand *this,CmdParams *params,CmdContext *context)

{
  long lVar1;
  long lVar2;
  int iVar3;
  Executable *pEVar4;
  offset_t oVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  addr_type type;
  addr_type type_00;
  string local_70;
  string local_50;
  
  pEVar4 = cmd_util::getExeFromContext(context);
  oVar5 = cmd_util::readOffset(this->addrFrom);
  iVar3 = (*(pEVar4->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x17])
                    (pEVar4,oVar5,(ulong)this->addrFrom,(ulong)this->addrTo);
  if (CONCAT44(extraout_var,iVar3) != -1) {
    poVar6 = std::operator<<((ostream *)&std::cout,"[");
    cmd_util::addrTypeToStr_abi_cxx11_(&local_50,(cmd_util *)(ulong)this->addrFrom,type);
    poVar6 = std::operator<<(poVar6,(string *)&local_50);
    poVar6 = std::operator<<(poVar6,"]");
    poVar6 = std::operator<<(poVar6,"\t->\t");
    poVar6 = std::operator<<(poVar6,"[");
    cmd_util::addrTypeToStr_abi_cxx11_(&local_70,(cmd_util *)(ulong)this->addrTo,type_00);
    poVar6 = std::operator<<(poVar6,(string *)&local_70);
    poVar6 = std::operator<<(poVar6,"]");
    std::operator<<(poVar6,":\n");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = *(long *)(std::cout + -0x18);
    std::ios::fill();
    QIODevice::errorString[lVar1] = (code)0x30;
    poVar6 = std::operator<<((ostream *)&std::cout,"[");
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"]");
    std::operator<<((ostream *)&std::cout,"\t->\t");
    lVar1 = *(long *)(std::cout + -0x18);
    std::ios::fill();
    QIODevice::errorString[lVar1] = (code)0x30;
    poVar6 = std::operator<<((ostream *)&std::cout,"[");
    lVar1 = *(long *)poVar6;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar6 + lVar2 + 0x18) = *(uint *)(poVar6 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar6 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"]");
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"[WARNING] This address cannot be mapped");
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void ConvertAddrCommand::execute(CmdParams *params, CmdContext  *context)
{
    Executable *exe = cmd_util::getExeFromContext(context);
    offset_t offset = cmd_util::readOffset(addrFrom);

    offset_t outOffset = exe->convertAddr(offset, addrFrom, addrTo);
    if (outOffset == INVALID_ADDR) {
        std::cout << "[WARNING] This address cannot be mapped" << std::endl;
        return;
    }
    std::cout << "[" << cmd_util::addrTypeToStr(addrFrom) << "]"
    	<< "\t->\t"
    	<< "[" << cmd_util::addrTypeToStr(addrTo) << "]"
    	<< ":\n";
    OUT_PADDED_OFFSET(std::cout, offset);
    std::cout << "\t->\t";
    OUT_PADDED_OFFSET(std::cout, outOffset);
    std::cout << std::endl;
}